

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_debug_line_header.cpp
# Opt level: O3

void __thiscall
pstore::exchange::import_ns::debug_line_index::debug_line_index
          (debug_line_index *this,not_null<context_*> ctxt,not_null<transaction_base_*> transaction)

{
  (this->super_rule).context_.ptr_ = ctxt.ptr_;
  (this->super_rule)._vptr_rule = (_func_int **)&PTR__debug_line_index_0015bf08;
  index::
  get_index<(pstore::trailer::indices)1,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&this->index_,(transaction.ptr_)->db_,true);
  *(undefined8 *)&(this->digest_).v_ = 0;
  *(undefined8 *)((long)&(this->digest_).v_ + 8) = 0;
  (this->transaction_).ptr_ = transaction.ptr_;
  return;
}

Assistant:

debug_line_index::debug_line_index (not_null<context *> const ctxt,
                                                not_null<transaction_base *> const transaction)
                    : rule (ctxt)
                    , index_{index::get_index<trailer::indices::debug_line_header> (
                          transaction->db ())}
                    , transaction_{transaction} {}